

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_encode.cpp
# Opt level: O1

void __thiscall
ktx::CommandEncode::processOptions(CommandEncode *this,Options *opts,ParseResult *args)

{
  Reporter *report;
  BasisCodec BVar1;
  bool bVar2;
  uint uVar3;
  
  report = &(this->super_Command).super_Reporter;
  Combine<ktx::CommandEncode::OptionsEncode,_ktx::OptionsEncodeASTC,_ktx::OptionsEncodeBasis<true>,_ktx::OptionsEncodeCommon,_ktx::OptionsMetrics,_ktx::OptionsDeflate,_ktx::OptionsSingleInSingleOut,_ktx::OptionsGeneric>
  ::process(&this->options,opts,args,report);
  (this->options).super_OptionsEncodeBasis<true>.super_ktxBasisParams.threadCount =
       (this->options).super_OptionsEncodeCommon.threadCount;
  (this->options).super_OptionsEncodeBasis<true>.super_ktxBasisParams.normalMap =
       (this->options).super_OptionsEncodeCommon.normalMap;
  (this->options).super_OptionsEncodeBasis<true>.super_ktxBasisParams.noSSE =
       (this->options).super_OptionsEncodeCommon.noSSE;
  BVar1 = (this->options).super_OptionsEncodeBasis<true>.codec;
  if (((BVar1 == INVALID) || (BVar1 == NONE)) &&
     ((this->options).super_OptionsEncode.vkFormat == VK_FORMAT_UNDEFINED)) {
    Reporter::fatal_usage<char_const(&)[41]>
              (report,(char (*) [41])"Either codec or format must be specified");
  }
  if ((this->options).super_OptionsEncodeBasis<true>.codec == BasisLZ) {
    if ((this->options).super_OptionsDeflate.zstd.super__Optional_base<unsigned_int,_true,_true>.
        _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged == true) {
      Reporter::fatal_usage<char_const(&)[54]>
                (report,(char (*) [54])"Cannot encode to BasisLZ and supercompress with Zstd.");
    }
    if ((this->options).super_OptionsDeflate.zlib.super__Optional_base<unsigned_int,_true,_true>.
        _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged == true) {
      Reporter::fatal_usage<char_const(&)[54]>
                (report,(char (*) [54])"Cannot encode to BasisLZ and supercompress with ZLIB.");
    }
  }
  BVar1 = (this->options).super_OptionsEncodeBasis<true>.codec;
  bVar2 = isFormatAstc((this->options).super_OptionsEncode.vkFormat);
  uVar3 = BVar1 - BasisLZ;
  if (1 < uVar3 && ((this->options).super_OptionsEncodeCommon.field_0x29 == '\x01' && !bVar2)) {
    Reporter::fatal_usage<char_const(&)[70]>
              (report,(char (*) [70])
                      "--compare-ssim can only be used with BasisLZ, UASTC or ASTC encoding.");
  }
  if ((this->options).super_OptionsEncodeCommon.field_0x2a == '\x01') {
    if (bVar2) goto LAB_001869c5;
    if (1 < uVar3) {
      Reporter::fatal_usage<char_const(&)[70]>
                (report,(char (*) [70])
                        "--compare-psnr can only be used with BasisLZ, UASTC or ASTC encoding.");
    }
  }
  if (!bVar2) {
    return;
  }
LAB_001869c5:
  (this->options).super_OptionsEncodeASTC.encodeASTC = true;
  return;
}

Assistant:

void CommandEncode::processOptions(cxxopts::Options& opts, cxxopts::ParseResult& args) {
    options.process(opts, args, *this);

    fillOptionsCodecBasis<decltype(options)>(options);

    if ((options.codec == BasisCodec::NONE || options.codec == BasisCodec::INVALID) &&
        options.vkFormat == VK_FORMAT_UNDEFINED)
        fatal_usage("Either codec or format must be specified");

    if (options.codec == BasisCodec::BasisLZ) {
        if (options.zstd.has_value())
            fatal_usage("Cannot encode to BasisLZ and supercompress with Zstd.");

        if (options.zlib.has_value())
            fatal_usage("Cannot encode to BasisLZ and supercompress with ZLIB.");
    }

    const auto basisCodec = options.codec == BasisCodec::BasisLZ || options.codec == BasisCodec::UASTC;
    const auto astcCodec = isFormatAstc(options.vkFormat);
    const auto canCompare = basisCodec || astcCodec;

    if (options.compare_ssim && !canCompare)
        fatal_usage("--compare-ssim can only be used with BasisLZ, UASTC or ASTC encoding.");
    if (options.compare_psnr && !canCompare)
        fatal_usage("--compare-psnr can only be used with BasisLZ, UASTC or ASTC encoding.");

    if (astcCodec)
        options.encodeASTC = true;
}